

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O2

void __thiscall
dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildGlobals
          (GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *this)

{
  Module *pMVar1;
  Value *val;
  Module *pMVar2;
  NodesSeq<dg::dda::RWNode> cur;
  NodesSeq<dg::dda::RWNode> local_48;
  
  pMVar1 = this->_module;
  for (pMVar2 = pMVar1 + 0x10; pMVar2 = *(Module **)pMVar2, pMVar2 != pMVar1 + 8;
      pMVar2 = pMVar2 + 8) {
    val = (Value *)(pMVar2 + -0x38);
    if (pMVar2 == (Module *)0x0) {
      val = (Value *)0x0;
    }
    buildNode(&local_48,this,val);
    std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
    insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
              ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&this->_globals,
               (const_iterator)
               (this->_globals).
               super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                )local_48.nodes.
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                )local_48.nodes.
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
              ((_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&local_48);
  }
  return;
}

Assistant:

void buildGlobals() {
        DBG_SECTION_BEGIN(dg, "Building globals");

        for (const auto &G : _module->globals()) {
            // every global node is like memory allocation
            auto cur = buildNode(&G);
            _globals.insert(_globals.end(), cur.begin(), cur.end());
        }

        DBG_SECTION_END(dg, "Building globals done");
    }